

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_btree.cc
# Opt level: O2

bool __thiscall
absl::lts_20250127::cord_internal::CordRepBtree::IsFlat
          (CordRepBtree *this,size_t offset,size_t n,string_view *fragment)

{
  ulong uVar1;
  CordRep *pCVar2;
  uint uVar3;
  Position PVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  string_view local_40;
  
  uVar1 = (this->super_CordRep).length;
  if (uVar1 < n) {
    __assert_fail("n <= this->length",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                  ,0x3d7,
                  "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
                 );
  }
  if (offset <= uVar1 - n) {
    if (n != 0) {
      uVar3 = (uint)(this->super_CordRep).storage[0];
      while( true ) {
        PVar4 = IndexOf(this,offset);
        offset = PVar4.n;
        pCVar2 = Edge(this,PVar4.index);
        if (pCVar2->length < offset + n) break;
        if ((int)uVar3 < 1) {
          if (fragment == (string_view *)0x0) {
            return true;
          }
          local_40 = EdgeData(pCVar2);
          bVar5 = std::basic_string_view<char,_std::char_traits<char>_>::substr(&local_40,offset,n);
          fragment->_M_len = bVar5._M_len;
          fragment->_M_str = bVar5._M_str;
          return true;
        }
        uVar3 = uVar3 - 1;
        pCVar2 = Edge(this,PVar4.index);
        this = CordRep::btree(pCVar2);
      }
    }
    return false;
  }
  __assert_fail("offset <= this->length - n",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/internal/cord_rep_btree.cc"
                ,0x3d8,
                "bool absl::cord_internal::CordRepBtree::IsFlat(size_t, const size_t, absl::string_view *) const"
               );
}

Assistant:

bool CordRepBtree::IsFlat(size_t offset, const size_t n,
                          absl::string_view* fragment) const {
  assert(n <= this->length);
  assert(offset <= this->length - n);
  if (ABSL_PREDICT_FALSE(n == 0)) return false;
  int height = this->height();
  const CordRepBtree* node = this;
  for (;;) {
    const Position front = node->IndexOf(offset);
    const CordRep* edge = node->Edge(front.index);
    if (edge->length < front.n + n) return false;
    if (--height < 0) {
      if (fragment) *fragment = EdgeData(edge).substr(front.n, n);
      return true;
    }
    offset = front.n;
    node = node->Edge(front.index)->btree();
  }
}